

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O0

bool __thiscall TURBOLINECOUNT::CLineCount::countLines(CLineCount *this,tlc_linecount_t *linecount)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  char *__s;
  reference pvVar4;
  reference pvVar5;
  int local_160;
  allocator<char> local_159;
  int i_2;
  undefined1 local_131;
  int local_130;
  int iStack_12c;
  bool success;
  int i_1;
  int errors;
  int complete;
  int local_fc;
  ulong uStack_f8;
  int i;
  tlc_fileoffset_t windowcount;
  allocator<char> local_d9;
  tlc_string_t local_d8;
  int local_b4;
  undefined1 local_b0 [4];
  int __err;
  stat64 statbuf;
  tlc_linecount_t *linecount_local;
  CLineCount *this_local;
  
  statbuf.__glibc_reserved[2] = (__syscall_slong_t)linecount;
  iVar2 = fstat64(this->m_fh,(stat64 *)local_b0);
  if (iVar2 == 0) {
    this->m_filesize = statbuf.st_rdev;
    if (this->m_filesize == 0) {
      *(undefined8 *)statbuf.__glibc_reserved[2] = 0;
      this_local._7_1_ = true;
    }
    else {
      uStack_f8 = (this->m_filesize + ((this->m_parameters).buffersize - 1)) /
                  (this->m_parameters).buffersize;
      if ((long)uStack_f8 < (long)(this->m_parameters).threadcount) {
        this->m_actual_thread_count = (int)uStack_f8;
      }
      else {
        this->m_actual_thread_count = (this->m_parameters).threadcount;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->m_threads,(long)this->m_actual_thread_count);
      std::vector<long,_std::allocator<long>_>::resize
                (&this->m_threadlinecounts,(long)this->m_actual_thread_count);
      this->m_thread_fail = false;
      for (local_fc = 0; local_fc < this->m_actual_thread_count; local_fc = local_fc + 1) {
        bVar1 = createThread(this,local_fc);
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&complete,"failed to create counting thread",
                     (allocator<char> *)((long)&errors + 3));
          setLastError(this,10,(tlc_string_t *)&complete);
          std::__cxx11::string::~string((string *)&complete);
          std::allocator<char>::~allocator((allocator<char> *)((long)&errors + 3));
          this->m_thread_fail = true;
          this->m_actual_thread_count = local_fc;
          break;
        }
      }
      i_1 = 0;
      iStack_12c = 0;
      for (local_130 = 0; local_130 < this->m_actual_thread_count; local_130 = local_130 + 1) {
        local_131 = 0;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_threads,(long)local_130);
        iVar2 = pthread_join(*pvVar4,(void **)0x0);
        local_131 = iVar2 == 0;
        if ((bool)local_131) {
          i_1 = i_1 + 1;
        }
        else {
          iStack_12c = iStack_12c + 1;
        }
      }
      if ((this->m_thread_fail & 1U) == 0) {
        if (i_1 == this->m_actual_thread_count) {
          *(undefined8 *)statbuf.__glibc_reserved[2] = 0;
          for (local_160 = 0; local_160 < this->m_actual_thread_count; local_160 = local_160 + 1) {
            pvVar5 = std::vector<long,_std::allocator<long>_>::operator[]
                               (&this->m_threadlinecounts,(long)local_160);
            *(value_type *)statbuf.__glibc_reserved[2] =
                 *pvVar5 + *(long *)statbuf.__glibc_reserved[2];
          }
          this_local._7_1_ = true;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&i_2,"thread join failed",&local_159);
          setLastError(this,10,(tlc_string_t *)&i_2);
          std::__cxx11::string::~string((string *)&i_2);
          std::allocator<char>::~allocator(&local_159);
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    local_b4 = iVar2;
    __s = strerror(iVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,__s,&local_d9);
    setLastError(this,iVar2,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CLineCount::countLines(tlc_linecount_t & linecount)
{
	// Determine file size
#ifdef _WIN32
	LARGE_INTEGER li;
	if (!GetFileSizeEx(m_fh, &li))
	{
		LCSETREALLASTERROR(EBADF, _T("unable to get file size"));
		return false;
	}
	m_filesize = li.QuadPart;
#else
	struct STAT statbuf;
	if(FSTAT(m_fh,&statbuf)!=0)
	{
		LCSETREALLASTERROR(EBADF, _T("unable to get file size"));
		return false;
	}
	m_filesize = statbuf.st_size;
#endif

	// Exit now for empty files
	if (m_filesize == 0)
	{
		linecount = 0;
		return true;
	}

	// Figure out actual thread count
	tlc_fileoffset_t windowcount = (m_filesize + (m_parameters.buffersize - 1)) / m_parameters.buffersize;
	if (windowcount < (tlc_fileoffset_t) m_parameters.threadcount)
	{
		m_actual_thread_count = (int)windowcount;
	}
	else
	{
		m_actual_thread_count = m_parameters.threadcount;
	}

//	printf("act: %d\n",m_actual_thread_count);

#ifdef _WIN32
	// Prepare file mapping
	m_filemapping = CreateFileMapping(m_fh, NULL, PAGE_READONLY, 0, 0, NULL);
#endif

	// Spin up threads
	m_threads.resize(m_actual_thread_count);
	m_threadlinecounts.resize(m_actual_thread_count);
	m_thread_fail = false;
	for (int i = 0; i < m_actual_thread_count; i++)
	{
		if (!createThread(i))
		{
			setLastError(ECHILD, _T("failed to create counting thread"));
			
			m_thread_fail = true;

			m_actual_thread_count = i;
			break;
		}
	}

	// Wait for threads to complete
	int complete = 0;
	int errors = 0;
	for (int i = 0; i < m_actual_thread_count; i++)
	{
		bool success = false;

#ifdef _WIN32
		success = (WaitForSingleObject(m_threads[i], INFINITE) == WAIT_OBJECT_0);
#else
		success = pthread_join(m_threads[i], NULL) == 0;
#endif
	
		if (success)
		{
			complete++;
		}
		else
		{
			errors++;
		}
	}

#ifdef _WIN32
	// Clean up file mapping
	CloseHandle(m_filemapping);
#endif

	if (m_thread_fail)
	{
		return false;
	}

	if (complete != m_actual_thread_count)
	{
		setLastError(ECHILD, _T("thread join failed"));
		return false;
	}

	// Sum up thread line counts and return
	linecount = 0;
	for (int i = 0; i < m_actual_thread_count; i++)
	{
		linecount += m_threadlinecounts[i];
	}
	
	return true;
}